

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

_Bool ssh_sftp_pw_setup(void *vctx,pollwrapper *pw)

{
  _Bool _Var1;
  int iVar2;
  int rwx;
  int fdstate;
  int local_20;
  int local_1c;
  
  if (((*(char *)((long)vctx + 1) == '\0') && (_Var1 = toplevel_callback_pending(), !_Var1)) &&
     (iVar2 = first_fd(&local_1c,&local_20), iVar2 < 0)) {
    *(undefined4 *)((long)vctx + 4) = 0xffffffff;
    return false;
  }
  if (*vctx == '\x01') {
    pollwrap_add_fd_rwx(pw,0,1);
  }
  return true;
}

Assistant:

static bool ssh_sftp_pw_setup(void *vctx, pollwrapper *pw)
{
    struct ssh_sftp_mainloop_ctx *ctx = (struct ssh_sftp_mainloop_ctx *)vctx;
    int fdstate, rwx;

    if (!ctx->no_fds_ok && !toplevel_callback_pending() &&
        first_fd(&fdstate, &rwx) < 0) {
        ctx->toret = -1;
        return false; /* terminate cli_main_loop */
    }

    if (ctx->include_stdin)
        pollwrap_add_fd_rwx(pw, 0, SELECT_R);

    return true;
}